

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# munkres.hxx
# Opt level: O0

void __thiscall
markurem::matching::
Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
::step_six(Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
           *this)

{
  vector<double,_std::allocator<double>_> *this_00;
  bool bVar1;
  pointer pAVar2;
  Value VVar3;
  reference pvVar4;
  vector<bool,_std::allocator<bool>_> *in_RDI;
  AdjacencyIterator it;
  unsigned_long *row;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  value_type *minval;
  Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *in_stack_ffffffffffffff68;
  Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
  *in_stack_ffffffffffffff70;
  value_type in_stack_ffffffffffffff88;
  reference local_68;
  reference local_58;
  Adjacency<unsigned_long> *local_48;
  __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
  in_stack_ffffffffffffffc0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_28;
  uint *local_20;
  value_type local_18;
  value_type *local_10;
  
  local_18 = find_smallest((Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
                            *)in_stack_ffffffffffffffc0._M_current);
  local_10 = &local_18;
  local_20 = &(in_RDI->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
              _M_finish.super__Bit_iterator_base._M_offset;
  local_28._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff68
                 );
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff68);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             *)in_stack_ffffffffffffff70,
                            (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             *)in_stack_ffffffffffffff68), bVar1) {
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator*(&local_28);
    andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
    adjacenciesFromVertexBegin(in_stack_ffffffffffffff68,0x1cfe15);
    while( true ) {
      local_48 = (Adjacency<unsigned_long> *)
                 andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
                 adjacenciesFromVertexEnd(in_stack_ffffffffffffff68,0x1cfe2f);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                          *)in_stack_ffffffffffffff70,
                         (__normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                          *)in_stack_ffffffffffffff68);
      if (!bVar1) break;
      local_58 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (in_RDI,(size_type)in_stack_ffffffffffffff88);
      bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_58);
      if (bVar1) {
        in_stack_ffffffffffffff88 = *local_10;
        this_00 = *(vector<double,_std::allocator<double>_> **)
                   &(in_RDI->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset;
        pAVar2 = __gnu_cxx::
                 __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                 ::operator->((__normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                               *)&stack0xffffffffffffffc0);
        VVar3 = andres::graph::Adjacency<unsigned_long>::edge(pAVar2);
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](this_00,VVar3);
        *pvVar4 = in_stack_ffffffffffffff88 + *pvVar4;
      }
      pAVar2 = __gnu_cxx::
               __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
               ::operator->((__normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                             *)&stack0xffffffffffffffc0);
      andres::graph::Adjacency<unsigned_long>::vertex(pAVar2);
      col_of_idx(in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68);
      local_68 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (in_RDI,(size_type)in_stack_ffffffffffffff88);
      bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_68);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        in_stack_ffffffffffffff70 =
             (Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
              *)*local_10;
        in_stack_ffffffffffffff68 =
             *(Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> **)
              &(in_RDI->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data
               ._M_start.super__Bit_iterator_base._M_offset;
        pAVar2 = __gnu_cxx::
                 __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                 ::operator->((__normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                               *)&stack0xffffffffffffffc0);
        VVar3 = andres::graph::Adjacency<unsigned_long>::edge(pAVar2);
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff68,
                            VVar3);
        *pvVar4 = *pvVar4 - (double)in_stack_ffffffffffffff70;
      }
      __gnu_cxx::
      __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
      ::operator++((__normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                    *)&stack0xffffffffffffffc0);
    }
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&local_28);
  }
  in_RDI[4].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 3;
  return;
}

Assistant:

void
Matching<GRAPH, COST, MASK>::step_six()
{
    auto const& minval = find_smallest();
    for (auto const& row : rows_) {
        for (auto it = graph_.adjacenciesFromVertexBegin(row);
             it != graph_.adjacenciesFromVertexEnd(row); ++it) {
            if (row_cover[row])
                costs_[it->edge()] += minval;
            if (!col_cover[col_of_idx(it->vertex())])
                costs_[it->edge()] -= minval;
        }
    }
    step_ = Step::FOUR;
}